

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

RepeatedFieldAccessor * __thiscall
google::protobuf::Reflection::RepeatedFieldAccessor(Reflection *this,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  RepeatedFieldAccessor *pRVar4;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (*(int *)(field + 0x4c) != 3) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x18c);
    pLVar3 = internal::LogMessage::operator<<(&local_48,"CHECK failed: field->is_repeated(): ");
    internal::LogFinisher::operator=(&local_49,pLVar3);
    internal::LogMessage::~LogMessage(&local_48);
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_ENUM:
    pRVar4 = (RepeatedFieldAccessor *)
             internal::Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>_>::
             get();
    break;
  case CPPTYPE_INT64:
    pRVar4 = (RepeatedFieldAccessor *)
             internal::Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>_>
             ::get();
    break;
  case CPPTYPE_UINT32:
    pRVar4 = (RepeatedFieldAccessor *)
             internal::
             Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>_>::
             get();
    break;
  case CPPTYPE_UINT64:
    pRVar4 = (RepeatedFieldAccessor *)
             internal::
             Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>_>::
             get();
    break;
  case CPPTYPE_DOUBLE:
    pRVar4 = (RepeatedFieldAccessor *)
             internal::
             Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>_>::get();
    break;
  case CPPTYPE_FLOAT:
    pRVar4 = (RepeatedFieldAccessor *)
             internal::Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>_>
             ::get();
    break;
  case CPPTYPE_BOOL:
    pRVar4 = (RepeatedFieldAccessor *)
             internal::Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>_>
             ::get();
    break;
  case CPPTYPE_STRING:
    pRVar4 = (RepeatedFieldAccessor *)
             internal::Singleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>::get();
    break;
  case CPPTYPE_MESSAGE:
    bVar1 = FieldDescriptor::is_map(field);
    if (bVar1) {
      pRVar4 = (RepeatedFieldAccessor *)
               internal::Singleton<google::protobuf::internal::MapFieldAccessor>::get();
    }
    else {
      pRVar4 = (RepeatedFieldAccessor *)
               internal::Singleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>::get
                         ();
    }
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x1a8);
    pLVar3 = internal::LogMessage::operator<<(&local_48,"Should not reach here.");
    internal::LogFinisher::operator=(&local_49,pLVar3);
    internal::LogMessage::~LogMessage(&local_48);
    pRVar4 = (RepeatedFieldAccessor *)0x0;
  }
  return pRVar4;
}

Assistant:

const internal::RepeatedFieldAccessor* Reflection::RepeatedFieldAccessor(
    const FieldDescriptor* field) const {
  GOOGLE_CHECK(field->is_repeated());
  switch (field->cpp_type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, type) \
    case FieldDescriptor::CPPTYPE_ ## TYPE: \
      return internal::Singleton<internal::RepeatedFieldPrimitiveAccessor<type> >::get();
    HANDLE_PRIMITIVE_TYPE(INT32, int32)
    HANDLE_PRIMITIVE_TYPE(UINT32, uint32)
    HANDLE_PRIMITIVE_TYPE(INT64, int64)
    HANDLE_PRIMITIVE_TYPE(UINT64, uint64)
    HANDLE_PRIMITIVE_TYPE(FLOAT, float)
    HANDLE_PRIMITIVE_TYPE(DOUBLE, double)
    HANDLE_PRIMITIVE_TYPE(BOOL, bool)
    HANDLE_PRIMITIVE_TYPE(ENUM, int32)
#undef HANDLE_PRIMITIVE_TYPE
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->options().ctype()) {
        default:
        case FieldOptions::STRING:
          return internal::Singleton<internal::RepeatedPtrFieldStringAccessor>::get();
      }
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (field->is_map()) {
        return internal::Singleton<internal::MapFieldAccessor>::get();
      } else {
        return internal::Singleton<internal::RepeatedPtrFieldMessageAccessor>::get();
      }
  }
  GOOGLE_LOG(FATAL) << "Should not reach here.";
  return NULL;
}